

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDivConstant.cpp
# Opt level: O0

void TPZShapeHDivConstant<pzshape::TPZShapePrism>::Initialize
               (TPZVec<long> *ids,TPZVec<int> *connectorders,TPZVec<int> *sideorient,
               TPZShapeData *data)

{
  int iVar1;
  TPZVec<int> *in_RSI;
  int ic;
  TPZManVector<int,_15> locconorders;
  int nedges;
  TPZShapeData *in_stack_fffffffffffffee0;
  TPZVec<int> *in_stack_fffffffffffffee8;
  TPZVec<long> *ids_00;
  undefined4 in_stack_fffffffffffffef8;
  int iVar2;
  undefined4 in_stack_fffffffffffffefc;
  TPZManVector<int,_20> *in_stack_ffffffffffffff00;
  int *in_stack_ffffffffffffff08;
  TPZManVector<int,_27> *in_stack_ffffffffffffff10;
  TPZVec<int> *in_stack_ffffffffffffff18;
  TPZManVector<int,_20> *in_stack_ffffffffffffff20;
  TPZVec<long> local_90 [4];
  TPZVec<int> *local_10;
  
  ids_00 = local_90;
  local_10 = in_RSI;
  TPZManVector<int,_20>::TPZManVector(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  TPZManVector<int,_20>::operator=
            (in_stack_ffffffffffffff00,
             (TPZManVector<int,_20> *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))
  ;
  TPZManVector<int,_20>::~TPZManVector((TPZManVector<int,_20> *)in_stack_fffffffffffffee0);
  TPZManVector<int,_27>::Resize(in_stack_ffffffffffffff10,(int64_t)in_stack_ffffffffffffff08);
  TPZManVector<int,_27>::Resize(in_stack_ffffffffffffff10,(int64_t)in_stack_ffffffffffffff08);
  TPZManVector<int,_15>::TPZManVector
            ((TPZManVector<int,_15> *)in_stack_ffffffffffffff10,(int64_t)in_stack_ffffffffffffff08,
             (int *)in_stack_ffffffffffffff00);
  for (iVar2 = 9; iVar2 < 0xf; iVar2 = iVar2 + 1) {
    in_stack_fffffffffffffee8 = (TPZVec<int> *)TPZVec<int>::operator[](local_10,(long)(iVar2 + -9));
    iVar1 = *(int *)&in_stack_fffffffffffffee8->_vptr_TPZVec;
    in_stack_fffffffffffffee0 =
         (TPZShapeData *)
         TPZVec<int>::operator[]((TPZVec<int> *)&stack0xffffffffffffff00,(long)iVar2);
    *(int *)in_stack_fffffffffffffee0 = iVar1;
  }
  TPZShapeHCurlNoGrads<pzshape::TPZShapePrism>::Initialize
            (ids_00,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  TPZManVector<int,_15>::~TPZManVector((TPZManVector<int,_15> *)in_stack_fffffffffffffee0);
  return;
}

Assistant:

void TPZShapeHDivConstant<TSHAPE>::Initialize(TPZVec<int64_t> &ids,
                TPZVec<int> &connectorders,
                const TPZVec<int>& sideorient, 
                TPZShapeData &data)
{
    data.fSideOrient = sideorient;
    data.fHDivConnectOrders.Resize(TSHAPE::NFacets+1);
    data.fHDivNumConnectShape.Resize(TSHAPE::NFacets+1);
    if(TSHAPE::Dimension == 2)
    {
        //Compatibilize the polynomial order
        int conSize = connectorders.size();
        for (int i = 0; i < conSize; i++){
            connectorders[i]++;
        }
        if (TSHAPE::Type() == ETriangle){
            connectorders[conSize-1]++;
        }
        //Initialize data structures
        TPZShapeH1<TSHAPE>::Initialize(ids,connectorders,data);

        for(int ic = 0; ic<TSHAPE::NFacets;ic++)
        {
            data.fHDivConnectOrders[ic] =  connectorders[ic];
            data.fHDivNumConnectShape[ic] = data.fH1NumConnectShape[ic]+1;
        }
        int ic = TSHAPE::NFacets;
        data.fHDivConnectOrders[ic] =  connectorders[ic];
        data.fHDivNumConnectShape[ic] = data.fH1NumConnectShape[ic];
    }
    else
    {
        //Compatibilize the polynomial order
        if (TSHAPE::Type() == ETetraedro) {
            int conSize = connectorders.size();
            for (int i = 0; i < conSize; i++){
                connectorders[i]++;
            }
            connectorders[conSize-1]++;
        }

        const int nedges = TSHAPE::NSides-TSHAPE::NFacets-TSHAPE::NCornerNodes-1;
        TPZManVector<int,15> locconorders(TSHAPE::NSides-TSHAPE::NCornerNodes,1);
        for(int ic = nedges; ic<TSHAPE::NSides-TSHAPE::NCornerNodes; ic++)
        {
            locconorders[ic] = connectorders[ic-nedges];
        }
        TPZShapeHCurlNoGrads<TSHAPE>::Initialize(ids, locconorders, data);
//        TPZManVector<int> HCurlNumConnectShapeF = data.fHDivNumConnectShape;
//        data.fHDivNumConnectShape.Resize(TSHAPE::NFacets+1);
//        for(int ic=nedges; ic<TSHAPE::NSides-TSHAPE::NCornerNodes-1; ic++)
//        {
//            int numshape = HCurlNumConnectShapeF[ic]+1;
//            data.fHDivNumConnectShape[ic-nedges] = numshape;
//        }
//        int ic = TSHAPE::NSides-TSHAPE::NCornerNodes-1;
//        int numshape = HCurlNumConnectShapeF[ic];
//        data.fHDivNumConnectShape[ic-nedges] = numshape;
    }
}